

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SpecialDelete(Fts5FullTable *pTab,sqlite3_value **apVal)

{
  int iVar1;
  sqlite3_int64 iDel_00;
  sqlite3_int64 iDel;
  int eType1;
  int rc;
  sqlite3_value **apVal_local;
  Fts5FullTable *pTab_local;
  
  iDel._4_4_ = 0;
  iVar1 = sqlite3_value_type(apVal[1]);
  if (iVar1 == 1) {
    iDel_00 = sqlite3_value_int64(apVal[1]);
    iDel._4_4_ = sqlite3Fts5StorageDelete(pTab->pStorage,iDel_00,apVal + 2);
  }
  return iDel._4_4_;
}

Assistant:

static int fts5SpecialDelete(
  Fts5FullTable *pTab, 
  sqlite3_value **apVal
){
  int rc = SQLITE_OK;
  int eType1 = sqlite3_value_type(apVal[1]);
  if( eType1==SQLITE_INTEGER ){
    sqlite3_int64 iDel = sqlite3_value_int64(apVal[1]);
    rc = sqlite3Fts5StorageDelete(pTab->pStorage, iDel, &apVal[2]);
  }
  return rc;
}